

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall
kj::BufferedInputStreamWrapper::BufferedInputStreamWrapper
          (BufferedInputStreamWrapper *this,InputStream *inner,ArrayPtr<unsigned_char> buffer)

{
  bool bVar1;
  ArrayPtr<unsigned_char> AVar2;
  InputStream *inner_local;
  BufferedInputStreamWrapper *this_local;
  ArrayPtr<unsigned_char> buffer_local;
  
  buffer_local.ptr = (uchar *)buffer.size_;
  this_local = (BufferedInputStreamWrapper *)buffer.ptr;
  BufferedInputStream::BufferedInputStream(&this->super_BufferedInputStream);
  (this->super_BufferedInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__BufferedInputStreamWrapper_002bb660;
  this->inner = inner;
  bVar1 = ArrayPtr<unsigned_char>::operator==((ArrayPtr<unsigned_char> *)&this_local,(void *)0x0);
  if (bVar1) {
    heapArray<unsigned_char>(&this->ownedBuffer,0x2000);
  }
  else {
    Array<unsigned_char>::Array(&this->ownedBuffer,(void *)0x0);
  }
  bVar1 = ArrayPtr<unsigned_char>::operator==((ArrayPtr<unsigned_char> *)&this_local,(void *)0x0);
  if (bVar1) {
    AVar2 = kj::Array::operator_cast_to_ArrayPtr((Array *)&this->ownedBuffer);
    this->buffer = AVar2;
  }
  else {
    (this->buffer).ptr = (uchar *)this_local;
    (this->buffer).size_ = (size_t)buffer_local.ptr;
  }
  ArrayPtr<unsigned_char>::ArrayPtr(&this->bufferAvailable);
  return;
}

Assistant:

BufferedInputStreamWrapper::BufferedInputStreamWrapper(InputStream& inner, ArrayPtr<byte> buffer)
    : inner(inner), ownedBuffer(buffer == nullptr ? heapArray<byte>(8192) : nullptr),
      buffer(buffer == nullptr ? ownedBuffer : buffer) {}